

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O0

Node * __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_false>::TermPass1
          (Parser<NullTerminatedUnicodeEncodingPolicy,_false> *this,MatchCharNode *deferredCharNode,
          bool *previousSurrogatePart)

{
  code *pcVar1;
  bool bVar2;
  EncodedChar EVar3;
  Char CVar4;
  CharCount lower_00;
  CharCount upper_00;
  ThreadContext *this_00;
  undefined4 *puVar5;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar6;
  DefineGroupNode *pDVar7;
  Node *pNVar8;
  DefineGroupNode *local_340;
  bool local_331;
  CharCount upper;
  CharCount lower;
  TrackAllocData local_268;
  code *local_240;
  undefined8 local_238;
  TrackAllocData local_230;
  code *local_208;
  undefined8 local_200;
  TrackAllocData local_1f8;
  code *local_1d0;
  undefined8 local_1c8;
  TrackAllocData local_1c0;
  code *local_198;
  undefined8 local_190;
  TrackAllocData local_188;
  int local_15c;
  code *pcStack_158;
  int thisGroupId_1;
  undefined8 local_150;
  TrackAllocData local_148;
  int local_11c;
  code *pcStack_118;
  int thisGroupId;
  undefined8 local_110;
  TrackAllocData local_108;
  code *local_e0;
  undefined8 local_d8;
  TrackAllocData local_d0;
  code *local_a8;
  undefined8 local_a0;
  TrackAllocData local_98;
  code *local_70;
  undefined8 local_68;
  TrackAllocData local_60;
  bool local_31;
  DefineGroupNode *pDStack_30;
  bool containsSurrogatePair;
  Node *node;
  bool *previousSurrogatePart_local;
  MatchCharNode *deferredCharNode_local;
  Parser<NullTerminatedUnicodeEncodingPolicy,_false> *this_local;
  
  node = (Node *)previousSurrogatePart;
  previousSurrogatePart_local = (bool *)deferredCharNode;
  deferredCharNode_local = (MatchCharNode *)this;
  this_00 = Js::ScriptContext::GetThreadContext(this->scriptContext);
  ThreadContext::ProbeStackNoDispose(this_00,0x6000,this->scriptContext,(PVOID)0x0);
  pDStack_30 = (DefineGroupNode *)0x0;
  local_31 = false;
  EVar3 = ECLookahead(this,0);
  switch(EVar3) {
  case L'\0':
    bVar2 = IsEOF(this);
    if (bVar2) {
      Fail(this,-0x7ff5ec67);
    }
  default:
    bVar2 = SurrogatePairPass1(this,(Node **)&stack0xffffffffffffffd0,
                               (MatchCharNode *)previousSurrogatePart_local,(bool *)node);
    if (!bVar2) {
      CVar4 = NextChar(this);
      *(Char *)(previousSurrogatePart_local + 0x38) = CVar4;
      pDStack_30 = (DefineGroupNode *)previousSurrogatePart_local;
    }
    break;
  case L'$':
    ECConsume(this,1);
    pAVar6 = &this->ctAllocator->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_98,(type_info *)&SimpleNode::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
               ,0x532);
    pAVar6 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar6,&local_98);
    local_a8 = Memory::ArenaAllocator::Alloc;
    local_a0 = 0;
    pNVar8 = (Node *)new<Memory::ArenaAllocator>(0x38,(ArenaAllocator *)pAVar6,0x3f67b0);
    SimpleNode::SimpleNode((SimpleNode *)pNVar8,EOL);
    return pNVar8;
  case L'(':
    ECConsume(this,1);
    EVar3 = ECLookahead(this,0);
    if (EVar3 == L'?') {
      EVar3 = ECLookahead(this,1);
      if (EVar3 == L'!') {
        ECConsume(this,2);
        pDStack_30 = (DefineGroupNode *)DisjunctionPass1(this);
        EVar3 = ECLookahead(this,0);
        if (EVar3 != L')') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x54f,"(ECLookahead() == \')\')","ECLookahead() == \')\'");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        ECConsume(this,1);
        pAVar6 = &this->ctAllocator->
                  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_108,(type_info *)&AssertionNode::typeinfo,0,0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                   ,0x551);
        pAVar6 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 TrackAllocInfo(pAVar6,&local_108);
        pcStack_118 = Memory::ArenaAllocator::Alloc;
        local_110 = 0;
        pDVar7 = (DefineGroupNode *)
                 new<Memory::ArenaAllocator>(0x48,(ArenaAllocator *)pAVar6,0x3f67b0);
        AssertionNode::AssertionNode((AssertionNode *)pDVar7,true,&pDStack_30->super_Node);
        pDStack_30 = pDVar7;
      }
      else if (EVar3 == L':') {
        ECConsume(this,2);
        pDStack_30 = (DefineGroupNode *)DisjunctionPass1(this);
        EVar3 = ECLookahead(this,0);
        if (EVar3 != L')') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x556,"(ECLookahead() == \')\')","ECLookahead() == \')\'");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        ECConsume(this,1);
      }
      else if (EVar3 == L'=') {
        ECConsume(this,2);
        pDStack_30 = (DefineGroupNode *)DisjunctionPass1(this);
        EVar3 = ECLookahead(this,0);
        if (EVar3 != L')') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x548,"(ECLookahead() == \')\')","ECLookahead() == \')\'");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        ECConsume(this,1);
        pAVar6 = &this->ctAllocator->
                  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_d0,(type_info *)&AssertionNode::typeinfo,0,0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                   ,0x54a);
        pAVar6 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 TrackAllocInfo(pAVar6,&local_d0);
        local_e0 = Memory::ArenaAllocator::Alloc;
        local_d8 = 0;
        pDVar7 = (DefineGroupNode *)
                 new<Memory::ArenaAllocator>(0x48,(ArenaAllocator *)pAVar6,0x3f67b0);
        AssertionNode::AssertionNode((AssertionNode *)pDVar7,false,&pDStack_30->super_Node);
        pDStack_30 = pDVar7;
      }
      else {
        local_11c = this->nextGroupId;
        this->nextGroupId = local_11c + 1;
        pDStack_30 = (DefineGroupNode *)DisjunctionPass1(this);
        EVar3 = ECLookahead(this,0);
        if (EVar3 != L')') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x55e,"(ECLookahead() == \')\')","ECLookahead() == \')\'");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        ECConsume(this,1);
        pAVar6 = &this->ctAllocator->
                  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_148,(type_info *)&DefineGroupNode::typeinfo,0,0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                   ,0x560);
        pAVar6 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 TrackAllocInfo(pAVar6,&local_148);
        pcStack_158 = Memory::ArenaAllocator::Alloc;
        local_150 = 0;
        pDVar7 = (DefineGroupNode *)
                 new<Memory::ArenaAllocator>(0x50,(ArenaAllocator *)pAVar6,0x3f67b0);
        DefineGroupNode::DefineGroupNode(pDVar7,local_11c,&pDStack_30->super_Node);
        pDStack_30 = pDVar7;
      }
    }
    else {
      local_15c = this->nextGroupId;
      this->nextGroupId = local_15c + 1;
      pDStack_30 = (DefineGroupNode *)DisjunctionPass1(this);
      EVar3 = ECLookahead(this,0);
      if (EVar3 != L')') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x56a,"(ECLookahead() == \')\')","ECLookahead() == \')\'");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      ECConsume(this,1);
      pAVar6 = &this->ctAllocator->
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_188,(type_info *)&DefineGroupNode::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                 ,0x56c);
      pAVar6 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               TrackAllocInfo(pAVar6,&local_188);
      local_198 = Memory::ArenaAllocator::Alloc;
      local_190 = 0;
      pDVar7 = (DefineGroupNode *)
               new<Memory::ArenaAllocator>(0x50,(ArenaAllocator *)pAVar6,0x3f67b0);
      DefineGroupNode::DefineGroupNode(pDVar7,local_15c,&pDStack_30->super_Node);
      pDStack_30 = pDVar7;
    }
    break;
  case L')':
  case L'|':
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x586,"(false)","false");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
    break;
  case L'*':
  case L'+':
  case L'?':
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x592,"(false)",
                       "Allowed only in the escaped form. These should be caught by TermPass0.");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
    break;
  case L'.':
    ECConsume(this,1);
    pDStack_30 = (DefineGroupNode *)GetNodeWithValidCharacterSet(this,L'.');
    break;
  case L'[':
    ECConsume(this,1);
    if ((this->unicodeFlagPresent & 1U) != 0) {
      local_331 = false;
      if (this->currentSurrogatePairNode != (SurrogatePairTracker *)0x0) {
        local_331 = this->currentSurrogatePairNode->rangeLocation == this->next;
      }
      local_31 = local_331;
    }
    if ((local_31 & 1U) == 0) {
      local_340 = (DefineGroupNode *)CharacterClassPass1<false>(this);
    }
    else {
      local_340 = (DefineGroupNode *)CharacterClassPass1<true>(this);
    }
    pDStack_30 = local_340;
    EVar3 = ECLookahead(this,0);
    if (EVar3 != L']') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x580,"(ECLookahead() == \']\')","ECLookahead() == \']\'");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    ECConsume(this,1);
    break;
  case L'\\':
    ECConsume(this,1);
    bVar2 = SurrogatePairPass1(this,(Node **)&stack0xffffffffffffffd0,
                               (MatchCharNode *)previousSurrogatePart_local,(bool *)node);
    if ((!bVar2) &&
       (bVar2 = AtomEscapePass1(this,(Node **)&stack0xffffffffffffffd0,
                                (MatchCharNode *)previousSurrogatePart_local,(bool *)node), bVar2))
    {
      return &pDStack_30->super_Node;
    }
    break;
  case L']':
    CVar4 = NextChar(this);
    *(Char *)(previousSurrogatePart_local + 0x38) = CVar4;
    pDStack_30 = (DefineGroupNode *)previousSurrogatePart_local;
    break;
  case L'^':
    ECConsume(this,1);
    pAVar6 = &this->ctAllocator->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_60,(type_info *)&SimpleNode::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
               ,0x52f);
    pAVar6 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar6,&local_60);
    local_70 = Memory::ArenaAllocator::Alloc;
    local_68 = 0;
    pNVar8 = (Node *)new<Memory::ArenaAllocator>(0x38,(ArenaAllocator *)pAVar6,0x3f67b0);
    SimpleNode::SimpleNode((SimpleNode *)pNVar8,BOL);
    return pNVar8;
  }
  if (pDStack_30 == (DefineGroupNode *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x5a7,"(node != 0)","node != 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = AtQuantifier(this);
  if (bVar2) {
    EVar3 = ECLookahead(this,0);
    if (EVar3 == L'*') {
      if (pDStack_30 == (DefineGroupNode *)previousSurrogatePart_local) {
        pAVar6 = &this->ctAllocator->
                  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_1c0,(type_info *)&MatchCharNode::typeinfo,0,0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                   ,0x5af);
        pAVar6 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 TrackAllocInfo(pAVar6,&local_1c0);
        local_1d0 = Memory::ArenaAllocator::Alloc;
        local_1c8 = 0;
        pDVar7 = (DefineGroupNode *)
                 new<Memory::ArenaAllocator>(0x48,(ArenaAllocator *)pAVar6,0x3f67b0);
        MatchCharNode::MatchCharNode
                  ((MatchCharNode *)pDVar7,(MatchCharNode *)previousSurrogatePart_local);
        pDStack_30 = pDVar7;
      }
      ECConsume(this,1);
      bVar2 = OptNonGreedy(this);
      pNVar8 = NewLoopNode(this,0,0xffffffff,bVar2,&pDStack_30->super_Node);
      return pNVar8;
    }
    if (EVar3 == L'+') {
      if (pDStack_30 == (DefineGroupNode *)previousSurrogatePart_local) {
        pAVar6 = &this->ctAllocator->
                  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_1f8,(type_info *)&MatchCharNode::typeinfo,0,0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                   ,0x5b4);
        pAVar6 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 TrackAllocInfo(pAVar6,&local_1f8);
        local_208 = Memory::ArenaAllocator::Alloc;
        local_200 = 0;
        pDVar7 = (DefineGroupNode *)
                 new<Memory::ArenaAllocator>(0x48,(ArenaAllocator *)pAVar6,0x3f67b0);
        MatchCharNode::MatchCharNode
                  ((MatchCharNode *)pDVar7,(MatchCharNode *)previousSurrogatePart_local);
        pDStack_30 = pDVar7;
      }
      ECConsume(this,1);
      bVar2 = OptNonGreedy(this);
      pNVar8 = NewLoopNode(this,1,0xffffffff,bVar2,&pDStack_30->super_Node);
      return pNVar8;
    }
    if (EVar3 == L'?') {
      if (pDStack_30 == (DefineGroupNode *)previousSurrogatePart_local) {
        pAVar6 = &this->ctAllocator->
                  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_230,(type_info *)&MatchCharNode::typeinfo,0,0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                   ,0x5b9);
        pAVar6 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 TrackAllocInfo(pAVar6,&local_230);
        local_240 = Memory::ArenaAllocator::Alloc;
        local_238 = 0;
        pDVar7 = (DefineGroupNode *)
                 new<Memory::ArenaAllocator>(0x48,(ArenaAllocator *)pAVar6,0x3f67b0);
        MatchCharNode::MatchCharNode
                  ((MatchCharNode *)pDVar7,(MatchCharNode *)previousSurrogatePart_local);
        pDStack_30 = pDVar7;
      }
      ECConsume(this,1);
      bVar2 = OptNonGreedy(this);
      pNVar8 = NewLoopNode(this,0,1,bVar2,&pDStack_30->super_Node);
      return pNVar8;
    }
    if (EVar3 == L'{') {
      if (pDStack_30 == (DefineGroupNode *)previousSurrogatePart_local) {
        pAVar6 = &this->ctAllocator->
                  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_268,(type_info *)&MatchCharNode::typeinfo,0,0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                   ,0x5bf);
        pAVar6 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 TrackAllocInfo(pAVar6,&local_268);
        pDVar7 = (DefineGroupNode *)
                 new<Memory::ArenaAllocator>(0x48,(ArenaAllocator *)pAVar6,0x3f67b0);
        MatchCharNode::MatchCharNode
                  ((MatchCharNode *)pDVar7,(MatchCharNode *)previousSurrogatePart_local);
        pDStack_30 = pDVar7;
      }
      ECConsume(this,1);
      lower_00 = RepeatCount(this);
      EVar3 = ECLookahead(this,0);
      if (EVar3 == L',') {
        ECConsume(this,1);
        EVar3 = ECLookahead(this,0);
        if (EVar3 == L'}') {
          ECConsume(this,1);
          bVar2 = OptNonGreedy(this);
          pNVar8 = NewLoopNode(this,lower_00,0xffffffff,bVar2,&pDStack_30->super_Node);
          return pNVar8;
        }
        upper_00 = RepeatCount(this);
        if (upper_00 < lower_00) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x5ce,"(lower <= upper)","lower <= upper");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        EVar3 = ECLookahead(this,0);
        if (EVar3 != L'}') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x5cf,"(ECLookahead() == \'}\')","ECLookahead() == \'}\'");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        ECConsume(this,1);
        bVar2 = OptNonGreedy(this);
        pNVar8 = NewLoopNode(this,lower_00,upper_00,bVar2,&pDStack_30->super_Node);
        return pNVar8;
      }
      if (EVar3 == L'}') {
        ECConsume(this,1);
        bVar2 = OptNonGreedy(this);
        pNVar8 = NewLoopNode(this,lower_00,lower_00,bVar2,&pDStack_30->super_Node);
        return pNVar8;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x5d7,"(false)","false");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x5dd,"(false)","false");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
  }
  return &pDStack_30->super_Node;
}

Assistant:

Node* Parser<P, IsLiteral>::TermPass1(MatchCharNode* deferredCharNode, bool& previousSurrogatePart)
    {
        PROBE_STACK_NO_DISPOSE(scriptContext, Js::Constants::MinStackRegex);

        Node* node = 0;
        bool containsSurrogatePair = false;
        switch (ECLookahead())
        {
        case '^':
            ECConsume();
            return Anew(ctAllocator, SimpleNode, Node::BOL); // No quantifier allowed
        case '$':
            ECConsume();
            return Anew(ctAllocator, SimpleNode, Node::EOL); // No quantifier allowed
        case '\\':
            ECConsume();
            if(SurrogatePairPass1(node, deferredCharNode, previousSurrogatePart))
            {
                break; // For quantifier
            }
            else if (AtomEscapePass1(node, deferredCharNode, previousSurrogatePart))
            {
                return node; // No quantifier allowed
            }
            break; // else: fall-through for opt quantifier
        case '(':
            ECConsume();
            switch (ECLookahead())
            {
            case '?':
                switch (ECLookahead(1))
                {
                case '=':
                    ECConsume(2); // ?=
                    node = DisjunctionPass1();
                    Assert(ECLookahead() == ')');
                    ECConsume(); // )
                    node = Anew(ctAllocator, AssertionNode, false, node);
                    break; // As per Annex B, allow this to be quantifiable
                case '!':
                    ECConsume(2); // ?!
                    node = DisjunctionPass1();
                    Assert(ECLookahead() == ')');
                    ECConsume(); // )
                    node = Anew(ctAllocator, AssertionNode, true, node);
                    break; // As per Annex B, allow this to be quantifiable
                case ':':
                    ECConsume(2); // ?:
                    node = DisjunctionPass1();
                    Assert(ECLookahead() == ')');
                    ECConsume(); // )
                    break; // fall-through for opt quantifier
                default:
                    {
                        // ? not yet consumed
                        int thisGroupId = nextGroupId++;
                        node = DisjunctionPass1();
                        Assert(ECLookahead() == ')');
                        ECConsume(); // )
                        node = Anew(ctAllocator, DefineGroupNode, thisGroupId, node);
                        break; // fall-through for opt quantifier
                    }
                }
                break;
            default:
                {
                    // next char not yet consumed
                    int thisGroupId = nextGroupId++;
                    node = DisjunctionPass1();
                    Assert(ECLookahead() == ')');
                    ECConsume(); // )
                    node = Anew(ctAllocator, DefineGroupNode, thisGroupId, node);
                    break; // fall-through for opt quantifier
                }
            }
            break;
        case '.':
            {
                ECConsume();
                node = GetNodeWithValidCharacterSet('.');
                break; // fall-through for opt quantifier
            }
        case '[':
            ECConsume();
            if (unicodeFlagPresent)
            {
                containsSurrogatePair = this->currentSurrogatePairNode != nullptr && this->currentSurrogatePairNode->rangeLocation == next;
            }

            node = containsSurrogatePair ? CharacterClassPass1<true>() : CharacterClassPass1<false>();

            Assert(ECLookahead() == ']');
            ECConsume(); // ]
            break; // fall-through for opt quantifier
#if DBG
        case ')':
        case '|':
            Assert(false);
            break;
#endif
        case ']':
            // SPEC DEVIATION: This should be syntax error, instead accept as itself
            deferredCharNode->cs[0] = NextChar();
            node = deferredCharNode;
            break; // fall-through for opt quantifier
#if DBG
        case '*':
        case '+':
        case '?':
            AssertMsg(false, "Allowed only in the escaped form. These should be caught by TermPass0.");
            break;
#endif
        case 0:
            if (IsEOF())
                // Terminating 0
                Fail(JSERR_RegExpSyntax);
            // else fall-through for embedded 0
        default:
            if(SurrogatePairPass1(node, deferredCharNode, previousSurrogatePart))
            {
                break; //For quantifier
            }
            else
            {
                deferredCharNode->cs[0] = NextChar();
                node = deferredCharNode;
                break; // fall-through for opt quantifier
            }
        }

        Assert(node != 0);

        if (AtQuantifier())
        {
            switch (ECLookahead())
            {
            case '*':
                if (node == deferredCharNode)
                    node = Anew(ctAllocator, MatchCharNode, *deferredCharNode);
                ECConsume();
                return NewLoopNode(0, CharCountFlag, OptNonGreedy(), node);
            case '+':
                if (node == deferredCharNode)
                    node = Anew(ctAllocator, MatchCharNode, *deferredCharNode);
                ECConsume();
                return NewLoopNode(1, CharCountFlag, OptNonGreedy(), node);
            case '?':
                if (node == deferredCharNode)
                    node = Anew(ctAllocator, MatchCharNode, *deferredCharNode);
                ECConsume();
                return NewLoopNode(0, 1, OptNonGreedy(), node);
            case '{':
                {
                    if (node == deferredCharNode)
                        node = Anew(ctAllocator, MatchCharNode, *deferredCharNode);
                    ECConsume();
                    CharCount lower = RepeatCount();
                    switch (ECLookahead())
                    {
                    case ',':
                        ECConsume();
                        if (ECLookahead() == '}')
                        {
                            ECConsume();
                            return NewLoopNode(lower, CharCountFlag, OptNonGreedy(), node);
                        }
                        else
                        {
                            CharCount upper = RepeatCount();
                            Assert(lower <= upper);
                            Assert(ECLookahead() == '}');
                            ECConsume(); // }
                            return NewLoopNode(lower, upper, OptNonGreedy(), node);
                        }
                    case '}':
                        ECConsume();
                        return NewLoopNode(lower, lower, OptNonGreedy(), node);
                    default:
                        Assert(false);
                        break;
                    }
                    break;
                }
            default:
                Assert(false);
                break;
            }
        }

        return node;
    }